

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O0

void __thiscall RenX_ModSystemPlugin::~RenX_ModSystemPlugin(RenX_ModSystemPlugin *this)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pPVar5;
  undefined8 uVar6;
  __sv_type _Var7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  size_t local_58;
  char *local_50;
  size_t local_48;
  char *local_40;
  _Self local_38;
  _Self local_30;
  iterator node;
  Server *server;
  size_t server_count;
  Core *core;
  RenX_ModSystemPlugin *this_local;
  
  *(undefined ***)this = &PTR_think_0012d348;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_0012d828;
  uVar2 = RenX::getCore();
  server = (Server *)RenX::Core::getServerCount();
  while (server != (Server *)0x0) {
    server = server + -1;
    node._M_node = (_List_node_base *)RenX::Core::getServer(uVar2);
    sVar3 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                      ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                       (node._M_node + 1));
    sVar4 = RenX::Server::getBotCount();
    if (sVar3 != sVar4) {
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                     (node._M_node + 1);
      while( true ) {
        local_38._M_node =
             (_List_node_base *)
             std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                       (node._M_node + 1);
        bVar1 = std::operator==(&local_30,&local_38);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
        if ((pPVar5->isBot & 1U) == 0) {
          pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&this->field_0x18);
          local_48 = _Var7._M_len;
          local_40 = _Var7._M_str;
          uVar6 = Jupiter::Config::operator[](&pPVar5->varData,local_48,local_40);
          bVar8 = sv("Group",5);
          local_58 = bVar8._M_len;
          local_50 = bVar8._M_str;
          Jupiter::Config::remove(uVar6,local_58,local_50);
          pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                    (&pPVar5->gamePrefix);
          pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                    (&pPVar5->formatNamePrefix);
          pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
          _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&pPVar5->adminType);
          bVar8._M_str = "administrator";
          bVar8._M_len = 0xd;
          bVar1 = std::operator==(bVar8,_Var7);
          if (bVar1) {
            pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
            pPVar5->access = 2;
          }
          else {
            pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
            _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&pPVar5->adminType);
            __x._M_str = "moderator";
            __x._M_len = 9;
            bVar1 = std::operator==(__x,_Var7);
            if (bVar1) {
              pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
              pPVar5->access = 1;
            }
            else {
              pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_30);
              pPVar5->access = 0;
            }
          }
        }
        std::_List_iterator<RenX::PlayerInfo>::operator++(&local_30);
      }
    }
  }
  std::__cxx11::
  list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::clear
            (&this->groups);
  std::__cxx11::string::~string((string *)&this->m_administratorGroup);
  std::__cxx11::string::~string((string *)&this->m_moderatorGroup);
  std::__cxx11::string::~string((string *)&this->m_atmDefault);
  std::__cxx11::
  list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::~list
            (&this->groups);
  RenX::Plugin::~Plugin(&this->super_Plugin);
  return;
}

Assistant:

RenX_ModSystemPlugin::~RenX_ModSystemPlugin() {
	RenX::Core *core = RenX::getCore();
	size_t server_count = core->getServerCount();
	RenX::Server *server;
	while (server_count != 0) {
		server = core->getServer(--server_count);
		if (server->players.size() != server->getBotCount()) {
			for (auto node = server->players.begin(); node != server->players.end(); ++node) {
				if (node->isBot == false) {
					node->varData[RenX_ModSystemPlugin::name].remove("Group"sv);
					node->gamePrefix.clear();
					node->formatNamePrefix.clear();
					if (node->adminType == game_administrator_name)
						node->access = 2;
					else if (node->adminType == game_moderator_name)
						node->access = 1;
					else
						node->access = 0;
				}
			}
		}
	}

	RenX_ModSystemPlugin::groups.clear();
}